

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

istream * operator>>(istream *is,Date *dd)

{
  istream *piVar1;
  char ch4;
  char ch3;
  char ch2;
  char ch1;
  int d;
  int m;
  int y;
  Date local_20;
  
  piVar1 = std::operator>>(is,&ch1);
  piVar1 = (istream *)std::istream::operator>>((istream *)piVar1,&y);
  piVar1 = std::operator>>(piVar1,&ch2);
  piVar1 = (istream *)std::istream::operator>>((istream *)piVar1,&m);
  piVar1 = std::operator>>(piVar1,&ch3);
  piVar1 = (istream *)std::istream::operator>>((istream *)piVar1,&d);
  std::operator>>(piVar1,&ch4);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
    if ((((ch1 == '(') && (ch2 == ',')) && (ch3 == ',')) && (ch4 == ')')) {
      Date::Date(&local_20,y,m,d);
      dd->days = (long)local_20;
    }
    else {
      std::ios::clear((int)*(long *)(*(long *)is + -0x18) + (int)is);
    }
  }
  return is;
}

Assistant:

std::istream& operator>>(std::istream& is, Date& dd)
{
	int y, m, d;
	char ch1, ch2, ch3, ch4;
	is >> ch1 >> y >> ch2 >> m >> ch3 >> d >> ch4;
	if (!is) return is;
	if (ch1 != '(' || ch2 != ',' || ch3 != ',' || ch4 != ')') { // oops: format error
		is.clear(std::ios_base::failbit); // set the fail bit
		return is;
	}
	dd = Date(y, Month(m), d); // update dd
	return is;
}